

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_6b0f33::TransformSelectorAt::Validate(TransformSelectorAt *this,size_t count)

{
  int *piVar1;
  int *piVar2;
  vector<int,_std::allocator<int>_> indexes;
  int local_54;
  vector<int,_std::allocator<int>_> *local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = &(this->super_TransformSelectorIndexes).Indexes;
  piVar1 = (this->super_TransformSelectorIndexes).Indexes.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  for (piVar2 = (this->super_TransformSelectorIndexes).Indexes.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    local_54 = TransformSelectorIndexes::NormalizeIndex
                         (&this->super_TransformSelectorIndexes,*piVar2,count);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_48,&local_54);
  }
  std::vector<int,_std::allocator<int>_>::_M_move_assign(local_50,&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return true;
}

Assistant:

bool Validate(std::size_t count) override
  {
    decltype(Indexes) indexes;

    for (auto index : Indexes) {
      indexes.push_back(this->NormalizeIndex(index, count));
    }
    this->Indexes = std::move(indexes);

    return true;
  }